

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

sexp_conflict
make_opcode_procedure(sexp_conflict ctx,sexp_conflict op,sexp_uint_t i,sexp_sint_t flags)

{
  sexp_conflict psVar1;
  sexp key;
  sexp psVar2;
  sexp ctx_00;
  sexp_uint_t sVar3;
  uint uVar4;
  sexp psVar5;
  sexp cell;
  char *message;
  uint uVar6;
  long lVar7;
  sexp_conflict ctx2;
  sexp_conflict refs;
  sexp_conflict params;
  sexp_conflict lambda;
  sexp_conflict ref;
  sexp_conflict bc;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_f8;
  sexp local_f0;
  sexp local_e8;
  sexp local_e0;
  uint local_d4;
  sexp_uint_t local_d0;
  sexp local_c8;
  sexp local_c0;
  sexp_sint_t local_b8;
  sexp local_b0;
  sexp_gc_var_t local_a8;
  sexp_gc_var_t local_90;
  sexp_gc_var_t local_80;
  sexp_gc_var_t local_70;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  lVar7 = ((uint)flags & 1) + i;
  uVar6 = (uint)lVar7;
  local_c0 = (sexp)0x43e;
  local_a8.var = (sexp_conflict *)0x0;
  local_a8.next = (sexp_gc_var_t *)0x0;
  local_e8 = (sexp)0x43e;
  local_c8 = (sexp)&DAT_0000043e;
  local_f0 = (sexp)&DAT_0000043e;
  local_e0 = (sexp)0x43e;
  local_f8 = (sexp)0x43e;
  uVar4 = (uint)(op->value).opcode.num_args;
  if (uVar6 == uVar4) {
    psVar1 = (op->value).type.getters;
    if (psVar1 != (sexp_conflict)0x0) {
      return psVar1;
    }
LAB_0011fff3:
    local_a8.var = &local_c0;
    local_40.next = &local_a8;
    local_a8.next = (ctx->value).context.saves;
    local_40.var = &local_e8;
    local_50.next = &local_40;
    local_50.var = &local_c8;
    local_60.next = &local_50;
    local_60.var = &local_f0;
    local_70.next = &local_60;
    local_70.var = &local_e0;
    local_80.next = &local_70;
    local_80.var = &local_f8;
    local_90.next = &local_80;
    lVar7 = lVar7 << 0x20;
    local_90.var = &local_b0;
    (ctx->value).context.saves = &local_90;
    local_b0 = (sexp)&DAT_0000023e;
    local_b8 = flags;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 0x20;
      psVar5 = (sexp)(lVar7 * 2 + 1);
      do {
        local_b0 = sexp_cons_op(ctx,(sexp)0x0,2,psVar5,local_b0);
        psVar5 = (sexp)((long)&psVar5[-1].value + 0x60be);
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    (ctx->value).context.saves = local_90.next;
    local_e8 = local_b0;
    local_e0 = sexp_make_lambda(ctx,local_b0);
    local_f8 = sexp_make_child_context(ctx,local_e0);
    psVar5 = sexp_extend_env(local_f8,(ctx->value).type.cpl,local_e8,local_e0);
    if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
      (local_f8->value).type.cpl = psVar5;
      local_f0 = (sexp)&DAT_0000023e;
      local_d0 = i;
      ctx_00 = local_f8;
      for (psVar2 = local_e8;
          (local_f8 = ctx_00, ((ulong)psVar2 & 3) == 0 && (local_d4 = uVar6, psVar2->tag == 6));
          psVar2 = (psVar2->value).type.cpl) {
        key = (psVar2->value).type.name;
        cell = sexp_env_cell(ctx,psVar5,key,0);
        local_c8 = sexp_make_ref(ctx_00,key,cell);
        if ((((ulong)local_c8 & 3) != 0) || (local_c8->tag != 0x13)) {
          sexp_push_op(local_f8,&local_f0,local_c8);
        }
        uVar6 = local_d4;
        ctx_00 = local_f8;
      }
      if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x13)) {
        local_f0 = sexp_reverse_op(ctx_00,(sexp)0x0,1,local_f0);
      }
      sVar3 = local_d0;
      psVar5 = sexp_cons_op(local_f8,(sexp)0x0,2,op,local_f0);
      if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
        local_f0 = psVar5;
        generate_opcode_app(local_f8,psVar5);
        local_c0 = sexp_complete_bytecode(local_f8);
        (local_c0->value).flonum = (op->value).flonum;
        psVar5 = sexp_make_procedure_op
                           (local_f8,(sexp)0x0,4,(sexp)(local_b8 * 2 + 1),(sexp)(sVar3 * 2 + 1),
                            local_c0,(sexp)&DAT_0000043e);
        if (uVar6 == (op->value).opcode.num_args) {
          (op->value).type.getters = psVar5;
        }
      }
    }
    (ctx->value).context.saves = local_a8.next;
    return psVar5;
  }
  if ((int)uVar6 < (int)uVar4) {
    message = "not enough args for opcode";
  }
  else {
    if (((op->value).opcode.flags & 1) != 0) goto LAB_0011fff3;
    message = "too many args for opcode";
  }
  psVar5 = sexp_compile_error(ctx,message,op);
  return psVar5;
}

Assistant:

static sexp make_opcode_procedure (sexp ctx, sexp op, sexp_uint_t i, sexp_sint_t flags) {
  int j = i+(flags & SEXP_PROC_VARIADIC);
  sexp ls, res, env;
  sexp_gc_var6(bc, params, ref, refs, lambda, ctx2);
  if (j == sexp_opcode_num_args(op)) { /* return before preserving */
    if (sexp_opcode_proc(op)) return sexp_opcode_proc(op);
  } else if (j < sexp_opcode_num_args(op)) {
    return sexp_compile_error(ctx, "not enough args for opcode", op);
  } else if (! sexp_opcode_variadic_p(op)) { /* i > num_args */
    return sexp_compile_error(ctx, "too many args for opcode", op);
  }
  sexp_gc_preserve6(ctx, bc, params, ref, refs, lambda, ctx2);
  params = make_param_list(ctx, j);
  lambda = sexp_make_lambda(ctx, params);
  ctx2 = sexp_make_child_context(ctx, lambda);
  env = sexp_extend_env(ctx2, sexp_context_env(ctx), params, lambda);
  if (sexp_exceptionp(env)) {
    res = env;
  } else {
    sexp_context_env(ctx2) = env;
    for (ls=params, refs=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls)) {
      ref = sexp_make_ref(ctx2, sexp_car(ls), sexp_env_cell(ctx, env, sexp_car(ls), 0));
      if (!sexp_exceptionp(ref)) sexp_push(ctx2, refs, ref);
    }
    if (!sexp_exceptionp(refs))
      refs = sexp_reverse(ctx2, refs);
    refs = sexp_cons(ctx2, op, refs);
    if (sexp_exceptionp(refs)) {
      res = refs;
    } else {
      generate_opcode_app(ctx2, refs);
      bc = sexp_complete_bytecode(ctx2);
      sexp_bytecode_name(bc) = sexp_opcode_name(op);
      res=sexp_make_procedure(ctx2, sexp_make_fixnum(flags), sexp_make_fixnum(i), bc, SEXP_VOID);
      if (j == sexp_opcode_num_args(op))
        sexp_opcode_proc(op) = res;
    }
  }
  sexp_gc_release6(ctx);
  return res;
}